

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::Generate(cmMakefile *this,cmLocalGenerator *lg)

{
  bool bVar1;
  string *lhs;
  cmake *this_00;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue oldValue;
  cmLocalGenerator *lg_local;
  cmMakefile *this_local;
  
  oldValue.Value = (string *)lg;
  DoGenerate(this,lg);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_BACKWARDS_COMPATIBILITY",&local_41);
  local_20 = GetDefinition(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar1) {
    lhs = cmValue::operator_cast_to_string_(&local_20);
    bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhs,"2.4");
    if (bVar1) {
      this_00 = GetCMakeInstance(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,
                 "You have set CMAKE_BACKWARDS_COMPATIBILITY to a CMake version less than 2.4. This version of CMake only supports backwards compatibility with CMake 2.4 or later. For compatibility with older versions please use any CMake 2.8.x release or lower."
                 ,&local_79);
      cmake::IssueMessage(this_00,FATAL_ERROR,&local_78,&this->Backtrace);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
    }
  }
  return;
}

Assistant:

void cmMakefile::Generate(cmLocalGenerator& lg)
{
  this->DoGenerate(lg);
  cmValue oldValue = this->GetDefinition("CMAKE_BACKWARDS_COMPATIBILITY");
  if (oldValue &&
      cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, oldValue, "2.4")) {
    this->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      "You have set CMAKE_BACKWARDS_COMPATIBILITY to a CMake version less "
      "than 2.4. This version of CMake only supports backwards compatibility "
      "with CMake 2.4 or later. For compatibility with older versions please "
      "use any CMake 2.8.x release or lower.",
      this->Backtrace);
  }
}